

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_s.cpp
# Opt level: O2

int isamax(int n,float *dx,int incx)

{
  int iVar1;
  float fVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  float *pfVar6;
  int iVar7;
  float fVar8;
  
  iVar3 = 0;
  if (0 < incx && 0 < n) {
    if (n == 1) {
      return 1;
    }
    fVar8 = ABS(*dx);
    if (incx != 1) {
      pfVar6 = dx + (uint)incx;
      iVar3 = 1;
      for (iVar7 = 2; iVar7 - n != 1; iVar7 = iVar7 + 1) {
        fVar2 = ABS(*pfVar6);
        iVar1 = iVar7;
        if (ABS(*pfVar6) <= fVar8) {
          fVar2 = fVar8;
          iVar1 = iVar3;
        }
        fVar8 = fVar2;
        pfVar6 = pfVar6 + (uint)incx;
        iVar3 = iVar1;
      }
      return iVar3;
    }
    uVar4 = 1;
    uVar5 = 1;
    while (iVar3 = (int)uVar4, (uint)n != uVar5) {
      pfVar6 = dx + uVar5;
      uVar5 = uVar5 + 1;
      if (fVar8 < ABS(*pfVar6)) {
        uVar4 = uVar5 & 0xffffffff;
        fVar8 = ABS(*pfVar6);
      }
    }
  }
  return iVar3;
}

Assistant:

int isamax ( int n, float dx[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    ISAMAX finds the index of the float vector element of maximum absolute value.
//
//  Discussion:
//
//    WARNING: This index is a 1-based index, not a 0-based index!
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    23 February 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, float X[*], the vector to be examined.
//
//    Input, int INCX, the increment between successive entries of SX.
//
//    Output, int ISAMAX, the index of the element of maximum
//    absolute value.
//
{
  float dmax;
  int i;
  int ix;
  int value;

  value = 0;

  if ( n < 1 || incx <= 0 )
  {
    return value;
  }

  value = 1;

  if ( n == 1 )
  {
    return value;
  }

  if ( incx == 1 )
  {
    dmax = fabs ( dx[0] );

    for ( i = 1; i < n; i++ )
    {
      if ( dmax < fabs ( dx[i] ) )
      {
        value = i + 1;
        dmax = fabs ( dx[i] );
      }
    }
  }
  else
  {
    ix = 0;
    dmax = fabs ( dx[0] );
    ix = ix + incx;

    for ( i = 1; i < n; i++ )
    {
      if ( dmax < fabs ( dx[ix] ) )
      {
        value = i + 1;
        dmax = fabs ( dx[ix] );
      }
      ix = ix + incx;
    }
  }

  return value;
}